

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_libpdreceive.c
# Opt level: O0

void * libpdreceive_donew(t_symbol *s)

{
  t_pd *x_00;
  t_libpdrec *x;
  t_symbol *s_local;
  
  x_00 = pd_new(libpdrec_class);
  x_00[6] = (t_pd)s;
  x_00[7] = (t_pd)&libpd_mainimp;
  pd_bind(x_00,s);
  return x_00;
}

Assistant:

static void *libpdreceive_donew(t_symbol *s) {
  t_libpdrec *x;
  x = (t_libpdrec *)pd_new(libpdrec_class);
  x->x_sym = s;
  x->x_hooks = &LIBPDSTUFF->i_hooks;
  pd_bind(&x->x_obj.ob_pd, s);
  return x;
}